

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O1

string * __thiscall
FBX::Decoder::readString_abi_cxx11_(string *__return_storage_ptr__,Decoder *this)

{
  char *pcVar1;
  byte bVar2;
  size_t sVar3;
  
  sVar3 = (this->stream).cursor;
  (this->stream).cursor = sVar3 + 1;
  pcVar1 = (this->stream).data + sVar3 + 1;
  bVar2 = pcVar1[-1];
  (this->stream).cursor = sVar3 + 1 + (ulong)bVar2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + bVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Decoder::readString() {
        size_t size = stream.read<uint8_t>();
        auto data = stream.read<char>(size);
        return std::string(data.begin, data.end);
    }